

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_rp_qsort(nk_rp_rect *array,uint len,_func_int_void_ptr_void_ptr *cmp)

{
  undefined4 uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined8 uVar4;
  nk_rp_coord nVar5;
  nk_rp_coord nVar6;
  nk_rp_coord nVar7;
  nk_rp_coord nVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  nk_rp_rect *pnVar15;
  nk_rp_rect *pnVar16;
  uint uVar17;
  ulong uVar18;
  nk_rp_rect tmp;
  nk_rp_rect pivot;
  uint stack [64];
  int local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  int iStack_14c;
  int local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  int iStack_13c;
  uint local_138 [66];
  
  uVar12 = (len >> 1) * 0x10dcd + 1;
  uVar13 = 0;
  uVar14 = 0;
  while( true ) {
    uVar10 = len;
    while (iVar9 = (int)uVar13, uVar14 + 1 < uVar10) {
      if (iVar9 == 0x40) {
        uVar10 = local_138[0];
      }
      uVar11 = (ulong)uVar10;
      if (iVar9 == 0x40) {
        uVar13 = 0;
      }
      pnVar15 = array + (uVar12 % (uVar10 - uVar14) + uVar14);
      local_148 = pnVar15->id;
      uStack_144._0_2_ = pnVar15->w;
      uStack_144._2_2_ = pnVar15->h;
      uStack_140._0_2_ = pnVar15->x;
      uStack_140._2_2_ = pnVar15->y;
      iStack_13c = pnVar15->was_packed;
      uVar12 = uVar12 * 0x10dcd + 1;
      local_138[uVar13] = uVar10;
      uVar18 = (ulong)(uVar14 - 1);
      while( true ) {
        do {
          uVar17 = (int)uVar18 + 1;
          uVar18 = (ulong)uVar17;
          pnVar15 = array + uVar18;
          iVar9 = (*cmp)(pnVar15,&local_148);
        } while (iVar9 < 0);
        do {
          uVar10 = (uint)uVar11;
          uVar11 = (ulong)(uVar10 - 1);
          pnVar16 = array + uVar11;
          iVar9 = (*cmp)(&local_148,pnVar16);
        } while (iVar9 < 0);
        if (uVar10 - 1 <= uVar17) break;
        uVar1 = pnVar15->id;
        uVar2 = pnVar15->w;
        uVar3 = pnVar15->h;
        uVar4._0_2_ = pnVar15->x;
        uVar4._2_2_ = pnVar15->y;
        uVar4._4_4_ = pnVar15->was_packed;
        nVar5 = pnVar16->w;
        nVar6 = pnVar16->h;
        nVar7 = pnVar16->x;
        nVar8 = pnVar16->y;
        iVar9 = pnVar16->was_packed;
        pnVar15->id = pnVar16->id;
        pnVar15->w = nVar5;
        pnVar15->h = nVar6;
        pnVar15->x = nVar7;
        pnVar15->y = nVar8;
        pnVar15->was_packed = iVar9;
        uStack_150 = (undefined4)uVar4;
        pnVar16->id = uVar1;
        pnVar16->w = uVar2;
        pnVar16->h = uVar3;
        pnVar16->x = (undefined2)uStack_150;
        pnVar16->y = uStack_150._2_2_;
        pnVar16->was_packed = uVar4._4_4_;
      }
      uVar13 = (ulong)((int)uVar13 + 1);
    }
    if (iVar9 == 0) break;
    uVar13 = (ulong)(iVar9 - 1);
    len = local_138[uVar13];
    uVar14 = uVar10;
  }
  return;
}

Assistant:

static void
nk_rp_qsort(struct nk_rp_rect *array, unsigned int len, int(*cmp)(const void*,const void*))
{
    /* iterative quick sort */
    #define NK_MAX_SORT_STACK 64
    unsigned right, left = 0, stack[NK_MAX_SORT_STACK], pos = 0;
    unsigned seed = len/2 * 69069+1;
    for (;;) {
        for (; left+1 < len; len++) {
            struct nk_rp_rect pivot, tmp;
            if (pos == NK_MAX_SORT_STACK) len = stack[pos = 0];
            pivot = array[left+seed%(len-left)];
            seed = seed * 69069 + 1;
            stack[pos++] = len;
            for (right = left-1;;) {
                while (cmp(&array[++right], &pivot) < 0);
                while (cmp(&pivot, &array[--len]) < 0);
                if (right >= len) break;
                tmp = array[right];
                array[right] = array[len];
                array[len] = tmp;
            }
        }
        if (pos == 0) break;
        left = len;
        len = stack[--pos];
    }
    #undef NK_MAX_SORT_STACK
}